

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void dgrminer::printResultsToFiles
               (results_crate *results,results_crate_anomalies *results_anomalies,PartialUnion *pu,
               string *output_file,bool set_of_graphs,bool compute_confidence,
               bool search_for_anomalies,bool append_to_file)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this;
  pointer piVar1;
  pointer pdVar2;
  pointer paVar3;
  pointer puVar4;
  ostream *poVar5;
  pointer pvVar6;
  int j;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  undefined3 in_register_00000081;
  size_t i_2;
  long lVar10;
  size_t i;
  ulong uVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string *local_468;
  undefined4 local_45c;
  PartialUnion *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ofstream myfile_1;
  ofstream myfile;
  
  local_45c = CONCAT31(in_register_00000081,set_of_graphs);
  std::ofstream::ofstream(&myfile);
  local_468 = output_file;
  local_458 = pu;
  if (append_to_file) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   output_file,"_nodes");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   output_file,"_nodes");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
    poVar5 = std::operator<<((ostream *)&myfile,"pattern,id,label_int,changetime");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  lVar10 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)(*(long *)&results->field_0x10 - *(long *)&results->result_nodes >> 4);
      uVar11 = uVar11 + 1) {
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      std::ostream::operator<<
                ((ostream *)&myfile,*(int *)(*(long *)&results->result_nodes + lVar10 + lVar7 * 4));
      if (lVar7 != 3) {
        std::operator<<((ostream *)&myfile,",");
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    lVar10 = lVar10 + 0x10;
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_edges");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_edges");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
    poVar5 = std::operator<<((ostream *)&myfile,"pattern,src,dst,label_int,direction,edgetime");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  lVar10 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)(((long)(results->result_edges).
                              super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(results->result_edges).
                             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar11 = uVar11 + 1
      ) {
    lVar7 = -6;
    while (lVar7 != 0) {
      std::ostream::operator<<
                ((ostream *)&myfile,
                 *(int *)((long)(results->result_edges).
                                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems +
                         lVar7 * 4 + lVar10));
      lVar7 = lVar7 + 1;
      if (lVar7 != 0) {
        std::operator<<((ostream *)&myfile,",");
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    lVar10 = lVar10 + 0x18;
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_measures");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_measures");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
    std::operator<<((ostream *)&myfile,"support_absolute,support_relative");
    if (compute_confidence) {
      std::operator<<((ostream *)&myfile,",confidence");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&myfile);
  }
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(results->support_absolute).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(results->support_absolute).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)&myfile);
    std::operator<<((ostream *)&myfile,",");
    std::ostream::_M_insert<double>
              ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11]);
    if (compute_confidence) {
      std::operator<<((ostream *)&myfile,",");
      std::ostream::_M_insert<double>
                ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&myfile);
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_occurrences");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myfile_1,
                   local_468,"_occurrences");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&myfile_1);
    std::__cxx11::string::~string((string *)&myfile_1);
    pcVar9 = "graph_snapshots";
    if ((char)local_45c != '\0') {
      pcVar9 = "graphs";
    }
    poVar5 = std::operator<<((ostream *)&myfile,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  this = &results->occurrences;
  uVar11 = 0;
  while( true ) {
    pvVar6 = (results->occurrences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(results->occurrences).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar11)
    break;
    for (uVar8 = 0;
        lVar10 = *(long *)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar10 >> 2);
        uVar8 = uVar8 + 1) {
      std::ostream::operator<<((ostream *)&myfile,*(int *)(lVar10 + uVar8 * 4) + 1);
      pvVar6 = (this->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar8 < ((long)*(pointer *)
                          ((long)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data >> 2) - 1U) {
        std::operator<<((ostream *)&myfile,",");
        pvVar6 = (this->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    uVar11 = uVar11 + 1;
  }
  std::ofstream::close();
  psVar12 = local_468;
  if (search_for_anomalies) {
    std::ofstream::ofstream(&myfile_1);
    if (append_to_file) {
      std::operator+(&local_488,psVar12,"_anomalies_nodes");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      std::operator+(&local_488,psVar12,"_anomalies_nodes");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      poVar5 = std::operator<<((ostream *)&myfile_1,"anomaly_pattern,id,label_int,changetime");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    lVar10 = 0;
    for (uVar11 = 0;
        uVar11 < (ulong)(*(long *)&results_anomalies->field_0x10 -
                         *(long *)&results_anomalies->anomaly_result_nodes >> 4);
        uVar11 = uVar11 + 1) {
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        std::ostream::operator<<
                  ((ostream *)&myfile_1,
                   *(int *)(*(long *)&results_anomalies->anomaly_result_nodes + lVar10 + lVar7 * 4))
        ;
        if (lVar7 != 3) {
          std::operator<<((ostream *)&myfile_1,",");
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
      lVar10 = lVar10 + 0x10;
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(&local_488,local_468,"_anomalies_edges");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      std::operator+(&local_488,local_468,"_anomalies_edges");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      poVar5 = std::operator<<((ostream *)&myfile_1,
                               "anomaly_pattern,src,dst,label_int,direction,edgetime");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    lVar10 = 0;
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)(results_anomalies->anomaly_result_edges).
                                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(results_anomalies->anomaly_result_edges).
                               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar11 = uVar11 + 1) {
      lVar7 = -6;
      while (lVar7 != 0) {
        std::ostream::operator<<
                  ((ostream *)&myfile_1,
                   *(int *)((long)(results_anomalies->anomaly_result_edges).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_elems +
                           lVar7 * 4 + lVar10));
        lVar7 = lVar7 + 1;
        if (lVar7 != 0) {
          std::operator<<((ostream *)&myfile_1,",");
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
      lVar10 = lVar10 + 0x18;
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(&local_488,local_468,"_anomalies_explanation");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      std::operator+(&local_488,local_468,"_anomalies_explanation");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::operator<<((ostream *)&myfile_1,"anomaly_pattern,pattern");
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
    }
    for (uVar11 = 0;
        piVar1 = (results_anomalies->anomaly_id_of_anomalous_pattern).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar11 < (ulong)((long)(results_anomalies->anomaly_id_of_anomalous_pattern).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar11 = uVar11 + 1) {
      std::ostream::operator<<((ostream *)&myfile_1,piVar1[uVar11]);
      poVar5 = std::operator<<((ostream *)&myfile_1,",");
      std::ostream::operator<<
                (poVar5,(results_anomalies->anomaly_id_of_explanation_pattern).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar11]);
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
    }
    std::ofstream::close();
    psVar12 = local_468;
    if (append_to_file) {
      std::operator+(&local_488,local_468,"_anomalies_outlierness");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      std::operator+(&local_488,local_468,"_anomalies_outlierness");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::operator<<((ostream *)&myfile_1,"outlierness");
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
    }
    for (uVar11 = 0;
        pdVar2 = (results_anomalies->anomaly_outlierness).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,
        uVar11 < (ulong)((long)(results_anomalies->anomaly_outlierness).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
        uVar11 = uVar11 + 1) {
      std::ostream::_M_insert<double>(pdVar2[uVar11]);
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(&local_488,psVar12,"_anomalies_occurrences");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      std::operator+(&local_488,psVar12,"_anomalies_occurrences");
      std::ofstream::open((string *)&myfile_1,(_Ios_Openmode)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      pcVar9 = "graph_snapshots";
      if ((char)local_45c != '\0') {
        pcVar9 = "graphs";
      }
      poVar5 = std::operator<<((ostream *)&myfile_1,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    uVar11 = 0;
    while( true ) {
      pvVar6 = (results_anomalies->anomaly_occurrences).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(results_anomalies->anomaly_occurrences).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <=
          uVar11) break;
      for (uVar8 = 0;
          lVar10 = *(long *)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data,
          uVar8 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar6[uVar11].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + 8) - lVar10 >> 2);
          uVar8 = uVar8 + 1) {
        std::ostream::operator<<((ostream *)&myfile_1,*(int *)(lVar10 + uVar8 * 4) + 1);
        pvVar6 = (results_anomalies->anomaly_occurrences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar8 < ((long)*(pointer *)
                            ((long)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data >> 2) - 1U) {
          std::operator<<((ostream *)&myfile_1,",");
          pvVar6 = (results_anomalies->anomaly_occurrences).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&myfile_1);
      uVar11 = uVar11 + 1;
    }
    std::ofstream::close();
    psVar12 = local_468;
    std::ofstream::~ofstream(&myfile_1);
  }
  if (!append_to_file) {
    std::operator+(&local_450,psVar12,"_encoding");
    PartialUnion::outputEncodingToFile(local_458,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
  }
  if (*(long *)&results->field_0x10 != *(long *)&results->result_nodes) {
    *(long *)&results->field_0x10 = *(long *)&results->result_nodes;
  }
  paVar3 = (results->result_edges).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar3) {
    (results->result_edges).
    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar3;
  }
  puVar4 = (results->support_absolute).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  pdVar2 = (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(this);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&results->occurrences_antecedent);
  if (search_for_anomalies) {
    if (*(long *)&results_anomalies->field_0x10 != *(long *)&results_anomalies->anomaly_result_nodes
       ) {
      *(long *)&results_anomalies->field_0x10 = *(long *)&results_anomalies->anomaly_result_nodes;
    }
    paVar3 = (results_anomalies->anomaly_result_edges).
             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((results_anomalies->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar3) {
      (results_anomalies->anomaly_result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar3;
    }
    piVar1 = (results_anomalies->anomaly_id_of_anomalous_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((results_anomalies->anomaly_id_of_anomalous_pattern).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar1) {
      (results_anomalies->anomaly_id_of_anomalous_pattern).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar1;
    }
    piVar1 = (results_anomalies->anomaly_id_of_explanation_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((results_anomalies->anomaly_id_of_explanation_pattern).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar1) {
      (results_anomalies->anomaly_id_of_explanation_pattern).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar1;
    }
    pdVar2 = (results_anomalies->anomaly_outlierness).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((results_anomalies->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_finish != pdVar2) {
      (results_anomalies->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = pdVar2;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&results_anomalies->anomaly_occurrences);
  }
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void printResultsToFiles(results_crate * results, results_crate_anomalies * results_anomalies, PartialUnion pu, std::string output_file, bool set_of_graphs,
		bool compute_confidence, bool search_for_anomalies, bool append_to_file)
	{
		// NODES
		ofstream myfile;
		if (append_to_file) {
			myfile.open(output_file + "_nodes", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_nodes");
			myfile << "pattern,id,label_int,changetime" << endl;
		}
		for (size_t i = 0; i < results->result_nodes.size(); i++)
		{
			for (int j = 0; j < 4; j++)
			{
				myfile << results->result_nodes[i][j];
				if (j < 3) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// EDGES
		if (append_to_file) {
			myfile.open(output_file + "_edges", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_edges");
			myfile << "pattern,src,dst,label_int,direction,edgetime" << endl;
		}
		for (size_t i = 0; i < results->result_edges.size(); i++)
		{
			for (int j = 0; j < 6; j++)
			{
				myfile << results->result_edges[i][j];
				if (j < 5) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// MEASURES
		if (append_to_file) {
			myfile.open(output_file + "_measures", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_measures");
			myfile << "support_absolute,support_relative";
			if (compute_confidence)
			{
				myfile << ",confidence";
			}
			myfile << endl;
		}
		for (size_t i = 0; i < results->support_absolute.size(); i++)
		{
			myfile << results->support_absolute[i];
			myfile << "," << results->support[i];
			if (compute_confidence)
			{
				myfile << "," << results->confidence[i];
			}
			myfile << endl;
		}
		myfile.close();

		// index snapshots from 1

		// OCCURRENCES
		if (append_to_file) {
			myfile.open(output_file + "_occurrences", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_occurrences");
			if (set_of_graphs)
			{
				myfile << "graphs" << endl;
			}
			else
			{
				myfile << "graph_snapshots" << endl;
			}
		}
		for (size_t i = 0; i < results->occurrences.size(); i++)
		{

			for (int j = 0; j < results->occurrences[i].size(); j++)
			{
				myfile << (results->occurrences[i][j] + 1);
				if (j < results->occurrences[i].size() - 1) {
					myfile << ",";
				}
			}

			myfile << endl;
		}
		myfile.close();



		// print anomalies:
		if (search_for_anomalies)
		{
			// NODES
			ofstream myfile;
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_nodes", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_nodes");
				myfile << "anomaly_pattern,id,label_int,changetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_nodes.size(); i++)
			{
				for (int j = 0; j < 4; j++)
				{
					myfile << results_anomalies->anomaly_result_nodes[i][j];
					if (j < 3) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// EDGES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_edges", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_edges");
				myfile << "anomaly_pattern,src,dst,label_int,direction,edgetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_edges.size(); i++)
			{
				for (int j = 0; j < 6; j++)
				{
					myfile << results_anomalies->anomaly_result_edges[i][j];
					if (j < 5) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// LINKING TO FREQUENT PATTERNS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_explanation", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_explanation");
				myfile << "anomaly_pattern,pattern";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_id_of_anomalous_pattern.size(); i++)
			{
				myfile << results_anomalies->anomaly_id_of_anomalous_pattern[i];
				myfile << "," << results_anomalies->anomaly_id_of_explanation_pattern[i];
				myfile << endl;
			}
			myfile.close();

			// ANOMALY OUTLIERNESS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_outlierness", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_outlierness");
				myfile << "outlierness";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_outlierness.size(); i++)
			{
				myfile << results_anomalies->anomaly_outlierness[i];
				myfile << endl;
			}
			myfile.close();

			// index snapshots from 1

			// OCCURRENCES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_occurrences", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_occurrences");
				if (set_of_graphs)
				{
					myfile << "graphs" << endl;
				}
				else
				{
					myfile << "graph_snapshots" << endl;
				}
			}
			for (size_t i = 0; i < results_anomalies->anomaly_occurrences.size(); i++)
			{

				for (int j = 0; j < results_anomalies->anomaly_occurrences[i].size(); j++)
				{
					myfile << (results_anomalies->anomaly_occurrences[i][j] + 1);
					if (j < results_anomalies->anomaly_occurrences[i].size() - 1) {
						myfile << ",";
					}
				}

				myfile << endl;
			}
			myfile.close();
		}

		if (!append_to_file) {
			pu.outputEncodingToFile(output_file + "_encoding");
		}

		results->result_nodes.clear();
		results->result_edges.clear();
		results->support_absolute.clear();
		results->support.clear();
		results->confidence.clear();
		results->occurrences.clear();
		results->occurrences_antecedent.clear();

		if (search_for_anomalies)
		{
			results_anomalies->anomaly_result_nodes.clear();
			results_anomalies->anomaly_result_edges.clear();
			results_anomalies->anomaly_id_of_anomalous_pattern.clear();
			results_anomalies->anomaly_id_of_explanation_pattern.clear();
			results_anomalies->anomaly_outlierness.clear();
			results_anomalies->anomaly_occurrences.clear();
		}
	}